

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::ConvertSignatureToDer
          (ByteData *__return_storage_ptr__,ByteData *signature,SigHashType *sighash_type)

{
  value_type vVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_type sVar4;
  size_type sVar5;
  CfdException *this;
  uchar *bytes_out;
  undefined8 uVar6;
  reference pvVar7;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  ByteData *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe50;
  size_type in_stack_fffffffffffffe58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  CfdError error_code;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe60;
  uint32_t local_144;
  CfdSourceLocation local_140;
  undefined1 local_122;
  allocator local_121;
  string local_120 [32];
  CfdSourceLocation local_100;
  int local_e8 [2];
  int ret;
  CfdException *except;
  undefined1 local_98 [7];
  uint8_t flag;
  undefined1 local_7c [8];
  SigHashType temp_sighash;
  size_t written;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  SigHashType *sighash_type_local;
  ByteData *signature_local;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,signature);
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3f03e5);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (allocator_type *)in_stack_fffffffffffffe50);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3f0405);
  temp_sighash.hash_algorithm_ = kSigHashDefault;
  temp_sighash.is_anyone_can_pay_ = false;
  temp_sighash.is_fork_id_ = false;
  temp_sighash._10_2_ = 0;
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar4 - 2 <= sVar5) {
    SigHashType::SigHashType((SigHashType *)local_7c);
    ConvertSignatureFromDer((ByteData *)local_98,signature,(SigHashType *)local_7c);
    ByteData::~ByteData((ByteData *)0x3f046a);
    uVar2 = SigHashType::GetSigHashFlag(sighash_type);
    except._7_1_ = (undefined1)uVar2;
    uVar3 = SigHashType::GetSigHashFlag((SigHashType *)local_7c);
    if ((uVar2 & 0xff) == uVar3) {
      ByteData::ByteData(in_stack_fffffffffffffe40,
                         (ByteData *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      goto LAB_003f088a;
    }
  }
  in_stack_fffffffffffffe50 =
       (string *)
       &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  this = (CfdException *)
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3f061f);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffe50);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50;
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3f0649);
  sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  local_e8[0] = wally_ec_sig_to_der((uchar *)this,sVar4,bytes_out,sVar5,
                                    (size_t *)&temp_sighash.hash_algorithm_);
  if (local_e8[0] != 0) {
    local_100.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    error_code = (CfdError)((ulong)this_00 >> 0x20);
    local_100.filename = local_100.filename + 1;
    local_100.line = 0x32e;
    local_100.funcname = "ConvertSignatureToDer";
    logger::warn<int&>(&local_100,"wally_ec_sig_to_der NG[{}].",local_e8);
    local_122 = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_120,"der encode error.",&local_121);
    CfdException::CfdException(this,error_code,in_stack_fffffffffffffe50);
    local_122 = 0;
    __cxa_throw(uVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((ulong)temp_sighash._4_8_ < 0x49) {
    local_140.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_140.filename = local_140.filename + 1;
    local_140.line = 0x335;
    local_140.funcname = "ConvertSignatureToDer";
    local_144 = SigHashType::GetSigHashFlag(sighash_type);
    logger::info<unsigned_long&,unsigned_int>
              (&local_140,"size[{}]. append[{}]",(unsigned_long *)&temp_sighash.hash_algorithm_,
               &local_144);
    uVar2 = SigHashType::GetSigHashFlag(sighash_type);
    vVar1 = (value_type)uVar2;
    pvVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                        temp_sighash._4_8_);
    *pvVar7 = vVar1;
    temp_sighash._4_8_ = temp_sighash._4_8_ + 1;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,(size_type)this_00);
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
LAB_003f088a:
  except._0_4_ = 1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe50);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe50);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::ConvertSignatureToDer(
    const ByteData &signature, const SigHashType &sighash_type) {
  std::vector<uint8_t> sig = signature.GetBytes();
  // Secure the size considering SigHashType(1byte).
  std::vector<uint8_t> output(EC_SIGNATURE_DER_MAX_LEN + 1);
  size_t written = 0;

  if ((output.size() - 2) <= sig.size()) {
    try {
      SigHashType temp_sighash;
      ConvertSignatureFromDer(signature, &temp_sighash);
      uint8_t flag = static_cast<uint8_t>(sighash_type.GetSigHashFlag());
      if (flag == temp_sighash.GetSigHashFlag()) {
        return signature;
      }
    } catch (const CfdException &except) {
      info(
          CFD_LOG_SOURCE, "ConvertSignatureFromDer fail. fall through. ({})",
          std::string(except.what()));
    }
  }

  // Convert a compact signature to DER encoding.
  int ret = wally_ec_sig_to_der(
      sig.data(), sig.size(), output.data(), output.size(), &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_sig_to_der NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "der encode error.");
  }

  if (written <= EC_SIGNATURE_DER_MAX_LEN) {
    // add SigHashType
    info(
        CFD_LOG_SOURCE, "size[{}]. append[{}]", written,
        sighash_type.GetSigHashFlag());
    output[written] = static_cast<uint8_t>(sighash_type.GetSigHashFlag());
    ++written;
  }
  output.resize(written);

  return ByteData(output);
}